

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendDecimalValueInternal<long,duckdb::hugeint_t>
          (BaseAppender *this,Vector *col,long input)

{
  uint8_t width;
  uint8_t scale;
  InternalException *this_00;
  CastParameters parameters;
  undefined1 local_58 [32];
  optional_idx local_38;
  bool local_30;
  
  if (this->appender_type == PHYSICAL) {
    AppendValueInternal<long,duckdb::hugeint_t>(this,col,input);
    return;
  }
  if (this->appender_type == LOGICAL) {
    width = DecimalType::GetWidth(&col->type);
    scale = DecimalType::GetScale(&col->type);
    local_58._0_8_ = (BoundCastData *)0x0;
    local_58[8] = false;
    local_58._16_8_ = (string *)0x0;
    local_58._24_8_ = (FunctionLocalState *)0x0;
    local_38.index = 0xffffffffffffffff;
    local_30 = false;
    TryCastToDecimal::Operation<long,duckdb::hugeint_t>
              (input,(hugeint_t *)(col->data + (this->chunk).count * 0x10),
               (CastParameters *)local_58,width,scale);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_58._0_8_ = local_58 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Type not implemented for AppenderType","");
  InternalException::InternalException(this_00,(string *)local_58);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendDecimalValueInternal(Vector &col, SRC input) {
	switch (appender_type) {
	case AppenderType::LOGICAL: {
		auto &type = col.GetType();
		D_ASSERT(type.id() == LogicalTypeId::DECIMAL);
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		CastParameters parameters;
		auto &result = FlatVector::GetData<DST>(col)[chunk.size()];
		TryCastToDecimal::Operation<SRC, DST>(input, result, parameters, width, scale);
		return;
	}
	case AppenderType::PHYSICAL: {
		AppendValueInternal<SRC, DST>(col, input);
		return;
	}
	default:
		throw InternalException("Type not implemented for AppenderType");
	}
}